

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meaning.h
# Opt level: O0

void __thiscall SequenceMeaning::Dump(SequenceMeaning *this,ostream *out)

{
  Sexp *this_00;
  Activation *pAVar1;
  bool bVar2;
  reference ppSVar3;
  Sexp *b;
  iterator __end1;
  iterator __begin1;
  vector<Sexp_*,_std::allocator<Sexp_*>_> *__range1;
  ostream *out_local;
  SequenceMeaning *this_local;
  
  bVar2 = Sexp::IsMeaning(this->final_form);
  if (!bVar2) {
    __assert_fail("final_form->IsMeaning()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/meaning.h"
                  ,0xeb,"virtual void SequenceMeaning::Dump(std::ostream &)");
  }
  std::operator<<(out,"(meaning-sequence ");
  __end1 = std::vector<Sexp_*,_std::allocator<Sexp_*>_>::begin(&this->body);
  b = (Sexp *)std::vector<Sexp_*,_std::allocator<Sexp_*>_>::end(&this->body);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Sexp_**,_std::vector<Sexp_*,_std::allocator<Sexp_*>_>_>
                                *)&b);
    if (!bVar2) {
      bVar2 = Sexp::IsEmpty(this->final_form);
      if (!bVar2) {
        Sexp::Dump(this->final_form,out);
      }
      std::operator<<(out,")");
      return;
    }
    ppSVar3 = __gnu_cxx::__normal_iterator<Sexp_**,_std::vector<Sexp_*,_std::allocator<Sexp_*>_>_>::
              operator*(&__end1);
    this_00 = *ppSVar3;
    bVar2 = Sexp::IsMeaning(this_00);
    if (!bVar2) break;
    pAVar1 = (this_00->field_1).activation;
    (*(code *)(pAVar1->parent->field_1).symbol_value)(pAVar1,out);
    std::operator<<(out," ");
    __gnu_cxx::__normal_iterator<Sexp_**,_std::vector<Sexp_*,_std::allocator<Sexp_*>_>_>::operator++
              (&__end1);
  }
  __assert_fail("b->IsMeaning()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/meaning.h"
                ,0xee,"virtual void SequenceMeaning::Dump(std::ostream &)");
}

Assistant:

void Dump(std::ostream &out) override {
    assert(final_form->IsMeaning());
    out << "(meaning-sequence ";
    for (Sexp *b : body) {
      assert(b->IsMeaning());
      b->meaning->Dump(out);
      out << " ";
    }

    if (!final_form->IsEmpty()) {
      final_form->Dump(out);
    }

    out << ")";
  }